

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringConcat
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringConcat *curr)

{
  Literal *pLVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<wasm::GCData> sVar4;
  Iterator IVar5;
  undefined1 local_150 [8];
  Flow flow;
  Literals contents;
  undefined1 local_b8 [8];
  Literal left;
  Literal right;
  undefined1 local_58 [8];
  shared_ptr<wasm::GCData> leftData;
  shared_ptr<wasm::GCData> rightData;
  
  visit((Flow *)local_150,this,curr->left);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_150);
    Literal::Literal((Literal *)local_b8,pLVar1);
    visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->right);
    Flow::operator=((Flow *)local_150,(Flow *)&flow.breakTo.super_IString.str._M_str);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar1 = Flow::getSingleValue((Flow *)local_150);
      Literal::Literal((Literal *)&left.type,pLVar1);
      Literal::getGCData((Literal *)local_58);
      sVar4 = Literal::getGCData((Literal *)
                                 &leftData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
      if (local_58 == (undefined1  [8])0x0 ||
          leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"null ref",
                   sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
      }
      lVar2 = (long)leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[3]._vptr__Sp_counted_base -
              *(long *)&leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[2]._M_use_count;
      if (0x2aaaaa9 <
          *(long *)&(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count +
          (((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed +
          ((long)(((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                 flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible
                .super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18 + lVar2 / 0x18) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure",lVar2 % 0x18);
      }
      flow.breakTo.super_IString.str._M_str = (char *)0x0;
      SmallVector<wasm::Literal,_1UL>::reserve
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,
                 *(long *)&(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count +
                 (((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                 usedFixed +
                 ((long)(((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                        flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                       flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18 +
                 ((long)leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                 *(long *)&leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[2]._M_use_count) / 0x18);
      IVar5 = SmallVector<wasm::Literal,_1UL>::end
                        ((SmallVector<wasm::Literal,_1UL> *)((long)local_58 + 8));
      rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           IVar5.
           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
           .index;
      lVar2 = -0x18;
      for (p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != p_Var3 ||
          (SmallVector<wasm::Literal,_1UL> *)((long)local_58 + 8) !=
          IVar5.
          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          .parent; p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var3->_vptr__Sp_counted_base + 1)) {
        pLVar1 = (Literal *)
                 ((long)&((((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>
                          ).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start)->field_0 + lVar2);
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pLVar1 = (((Literals *)((long)local_58 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed
                   ._M_elems;
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,pLVar1)
        ;
        lVar2 = lVar2 + 0x18;
      }
      IVar5 = SmallVector<wasm::Literal,_1UL>::end
                        ((SmallVector<wasm::Literal,_1UL> *)
                         &(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count);
      rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           IVar5.
           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
           .index;
      lVar2 = -0x18;
      for (p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != p_Var3 ||
          (SmallVector<wasm::Literal,_1UL> *)
          &(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
           ->_M_use_count !=
          IVar5.
          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          .parent; p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var3->_vptr__Sp_counted_base + 1)) {
        pLVar1 = (Literal *)
                 (*(long *)&leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[2]._M_use_count + lVar2);
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pLVar1 = (Literal *)
                   (leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1);
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,pLVar1)
        ;
        lVar2 = lVar2 + 0x18;
      }
      makeGCData((Literal *)&right.type,this,(Literals *)&flow.breakTo.super_IString.str._M_str,
                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)86>).super_Expression.
                       type.id);
      Flow::Flow(__return_storage_ptr__,(Literal *)&right.type);
      Literal::~Literal((Literal *)&right.type);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rightData);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&leftData);
      Literal::~Literal((Literal *)&left.type);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_150);
    }
    Literal::~Literal((Literal *)local_b8);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_150);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_150);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringConcat(StringConcat* curr) {
    NOTE_ENTER("StringConcat");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    if (!leftData || !rightData) {
      trap("null ref");
    }

    auto totalSize = leftData->values.size() + rightData->values.size();
    if (totalSize >= DataLimit) {
      hostLimit("allocation failure");
    }

    Literals contents;
    contents.reserve(leftData->values.size() + rightData->values.size());
    for (Literal& l : leftData->values) {
      contents.push_back(l);
    }
    for (Literal& l : rightData->values) {
      contents.push_back(l);
    }

    return makeGCData(std::move(contents), curr->type);
  }